

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::LogToTTY(int max_depth)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  
  pIVar2 = GImGui;
  if (GImGui->LogEnabled == false) {
    if (GImGui->LogFile != (FILE *)0x0) {
      __assert_fail("g.LogFile == __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x1f4d,"void ImGui::LogToTTY(int)");
    }
    pIVar1 = GImGui->CurrentWindow;
    GImGui->LogFile = _stdout;
    pIVar2->LogEnabled = true;
    pIVar2->LogStartDepth = (pIVar1->DC).TreeDepth;
    if (-1 < max_depth) {
      pIVar2->LogAutoExpandMaxDepth = max_depth;
    }
  }
  return;
}

Assistant:

void ImGui::LogToTTY(int max_depth)
{
    ImGuiContext& g = *GImGui;
    if (g.LogEnabled)
        return;
    ImGuiWindow* window = g.CurrentWindow;

    IM_ASSERT(g.LogFile == NULL);
    g.LogFile = stdout;
    g.LogEnabled = true;
    g.LogStartDepth = window->DC.TreeDepth;
    if (max_depth >= 0)
        g.LogAutoExpandMaxDepth = max_depth;
}